

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

faidx_t * fai_load(char *fn)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  char *__filename;
  FILE *pFVar4;
  hFILE *fp;
  void *__dest;
  ssize_t sVar5;
  faidx_t *fai;
  BGZF *fp_00;
  ulong extraout_RAX;
  uint uVar6;
  ulong uVar7;
  FILE *local_38;
  
  sVar2 = strlen(fn);
  __s = (char *)calloc(sVar2 + 5,1);
  sprintf(__s,"%s.fai",fn);
  iVar1 = hisremote(__s);
  if (iVar1 == 0) {
    pFVar4 = fopen(__s,"rb");
  }
  else {
    sVar2 = strlen(__s);
    pcVar3 = __s + (int)sVar2;
    do {
      __filename = pcVar3;
      pcVar3 = __filename + -1;
      if (pcVar3 < __s) break;
    } while (*pcVar3 != '/');
    pFVar4 = fopen(__filename,"r");
    if (pFVar4 == (FILE *)0x0) {
      fp = hopen(__s,"rb");
      if (fp == (hFILE *)0x0) {
        pFVar4 = (FILE *)0x0;
        fprintf(_stderr,"[download_from_remote] fail to open remote file %s\n",__s);
      }
      else {
        pFVar4 = fopen(__filename,"wb");
        if (pFVar4 == (FILE *)0x0) {
          pFVar4 = (FILE *)0x0;
          fprintf(_stderr,"[download_from_remote] fail to create file in the working directory %s\n"
                  ,__filename);
          hclose_abruptly(fp);
        }
        else {
          __dest = calloc(0x100000,1);
          while( true ) {
            uVar7 = (long)fp->end - (long)fp->begin;
            sVar2 = 0x100000;
            if (uVar7 < 0x100000) {
              sVar2 = uVar7;
            }
            memcpy(__dest,fp->begin,sVar2);
            fp->begin = fp->begin + sVar2;
            uVar6 = 0x100000;
            if (uVar7 < 0x100000) {
              sVar5 = hread2(fp,__dest,0x100000,sVar2);
              uVar6 = (uint)sVar5;
            }
            if ((int)uVar6 < 1) break;
            fwrite(__dest,1,(ulong)(uVar6 & 0x7fffffff),pFVar4);
          }
          free(__dest);
          fclose(pFVar4);
          iVar1 = hclose(fp);
          if (iVar1 != 0) {
            fprintf(_stderr,"[download_from_remote] fail to close remote file %s\n",__s);
          }
          pFVar4 = fopen(__filename,"r");
        }
      }
    }
    if (pFVar4 == (FILE *)0x0) {
      fai_load_cold_1();
      return (faidx_t *)0x0;
    }
  }
  if ((pFVar4 != (FILE *)0x0) || (fai_load_cold_2(), pFVar4 = local_38, (extraout_RAX & 1) != 0)) {
    fai = fai_read((FILE *)pFVar4);
    fclose(pFVar4);
    fp_00 = bgzf_open(fn,"rb");
    fai->bgzf = fp_00;
    free(__s);
    if (fp_00 == (BGZF *)0x0) {
      fai_load_cold_3();
    }
    else {
      if (((undefined1  [96])*fp_00 & (undefined1  [96])0x60000000) != (undefined1  [96])0x20000000)
      {
        return fai;
      }
      iVar1 = bgzf_index_load(fp_00,fn,".gzi");
      if (-1 < iVar1) {
        return fai;
      }
      fprintf(_stderr,"[fai_load] failed to load .gzi index: %s[.gzi]\n",fn);
      fai_destroy(fai);
    }
  }
  return (faidx_t *)0x0;
}

Assistant:

faidx_t *fai_load(const char *fn)
{
    char *str;
    FILE *fp;
    faidx_t *fai;
    str = (char*)calloc(strlen(fn) + 5, 1);
    sprintf(str, "%s.fai", fn);

    if (hisremote(str))
    {
        fp = download_and_open(str);
        if ( !fp )
        {
            fprintf(stderr, "[fai_load] failed to open remote FASTA index %s\n", str);
            free(str);
            return 0;
        }
    }
    else
        fp = fopen(str, "rb");

    if (fp == 0) {
        fprintf(stderr, "[fai_load] build FASTA index.\n");
        fai_build(fn);
        fp = fopen(str, "rb");
        if (fp == 0) {
            fprintf(stderr, "[fai_load] fail to open FASTA index.\n");
            free(str);
            return 0;
        }
    }

    fai = fai_read(fp);
    fclose(fp);

    fai->bgzf = bgzf_open(fn, "rb");
    free(str);
    if (fai->bgzf == 0) {
        fprintf(stderr, "[fai_load] fail to open FASTA file.\n");
        return 0;
    }
    if ( fai->bgzf->is_compressed==1 )
    {
        if ( bgzf_index_load(fai->bgzf, fn, ".gzi") < 0 )
        {
            fprintf(stderr, "[fai_load] failed to load .gzi index: %s[.gzi]\n", fn);
            fai_destroy(fai);
            return NULL;
        }
    }
    return fai;
}